

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_bary3(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *bary)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  REF_GLOB *pRVar5;
  REF_DBL *pRVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  REF_DBL normal [3];
  REF_DBL local_48 [2];
  double local_38;
  
  iVar1 = *nodes;
  if (((-1 < (long)iVar1) && (iVar2 = ref_node->max, iVar1 < iVar2)) &&
     (pRVar5 = ref_node->global, -1 < pRVar5[iVar1])) {
    uVar3 = nodes[1];
    if (((int)uVar3 < iVar2 && -1 < (int)uVar3) && (-1 < pRVar5[uVar3])) {
      uVar4 = nodes[2];
      if (((int)uVar4 < iVar2 && -1 < (int)uVar4) && (-1 < pRVar5[uVar4])) {
        pRVar6 = ref_node->real;
        ref_node_xyz_normal(xyz,pRVar6 + uVar3 * 0xf,pRVar6 + uVar4 * 0xf,local_48);
        dVar7 = local_38;
        *bary = local_38;
        ref_node_xyz_normal(pRVar6 + (uint)(iVar1 * 0xf),xyz,pRVar6 + uVar4 * 0xf,local_48);
        dVar8 = local_38;
        bary[1] = local_38;
        ref_node_xyz_normal(pRVar6 + (uint)(iVar1 * 0xf),pRVar6 + uVar3 * 0xf,xyz,local_48);
        bary[2] = local_38;
        dVar9 = dVar7 + dVar8 + local_38;
        dVar11 = dVar9 * 1e+20;
        if (dVar11 <= -dVar11) {
          dVar11 = -dVar11;
        }
        dVar10 = dVar7;
        if (dVar7 <= -dVar7) {
          dVar10 = -dVar7;
        }
        if (dVar10 < dVar11) {
          dVar10 = dVar8;
          if (dVar8 <= -dVar8) {
            dVar10 = -dVar8;
          }
          if (dVar10 < dVar11) {
            dVar10 = local_38;
            if (local_38 <= -local_38) {
              dVar10 = -local_38;
            }
            if (dVar10 < dVar11) {
              *bary = dVar7 / dVar9;
              bary[1] = dVar8 / dVar9;
              bary[2] = local_38 / dVar9;
              return 0;
            }
          }
        }
        printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xae7,"ref_node_bary3");
        *bary = 0.0;
        bary[1] = 0.0;
        bary[2] = 0.0;
        return 4;
      }
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xacf,
         "ref_node_bary3",3,"node invalid");
  return 3;
}

Assistant:

REF_FCN REF_STATUS ref_node_bary3(REF_NODE ref_node, REF_INT *nodes,
                                  REF_DBL *xyz, REF_DBL *bary) {
  REF_DBL *xyz0, *xyz1, *xyz2;
  REF_DBL total, normal[3];

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]))
    RSS(REF_INVALID, "node invalid");

  xyz0 = ref_node_xyz_ptr(ref_node, nodes[0]);
  xyz1 = ref_node_xyz_ptr(ref_node, nodes[1]);
  xyz2 = ref_node_xyz_ptr(ref_node, nodes[2]);

  RSS(ref_node_xyz_normal(xyz, xyz1, xyz2, normal), "n0");
  bary[0] = normal[2];
  RSS(ref_node_xyz_normal(xyz0, xyz, xyz2, normal), "n1");
  bary[1] = normal[2];
  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz, normal), "n2");
  bary[2] = normal[2];

  total = bary[0] + bary[1] + bary[2];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
  } else {
    REF_INT i;
    printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, bary[0], bary[1], bary[2]);
    for (i = 0; i < 3; i++) bary[i] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}